

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O1

void RadianceTexture(void)

{
  double dVar1;
  uint uVar2;
  clock_t cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  Vector radiance;
  Random local_f0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Vector local_b0;
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  undefined1 local_68 [40];
  double local_40;
  
  if (0 < height) {
    local_98 = 0.0;
    dStack_90 = 1.0;
    iVar5 = 0;
    do {
      iVar6 = height;
      cVar3 = clock();
      uVar2 = (int)cVar3 * iVar6 + iVar5;
      uVar4 = uVar2 / 0x7fffffff << 0x1f | uVar2 / 0x7fffffff;
      local_f0._gen._M_x = (unsigned_long)(uVar4 + uVar2 + (uint)(uVar2 + uVar4 == 0));
      local_f0._dist._M_param._M_a = local_98;
      local_f0._dist._M_param._M_b = dStack_90;
      if (0 < width) {
        local_88 = ZEXT416((uint)(float)iVar5);
        iVar6 = 0;
        iVar7 = -1;
        do {
          iVar8 = (width + iVar7) * height;
          local_c8._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&local_f0._gen);
          local_c8._8_8_ = extraout_XMM0_Qb;
          local_d8._8_8_ = local_f0._dist._M_param._M_b;
          local_d8._0_8_ = local_f0._dist._M_param._M_a;
          local_78 = local_f0._dist._M_param._M_b;
          uStack_70 = 0;
          dVar9 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (&local_f0._gen);
          auVar11._0_4_ =
               (float)((double)local_c8._0_8_ * (local_78 - (double)local_d8._0_8_) +
                      (double)local_d8._0_8_) + (float)iVar6;
          auVar11._4_4_ =
               (float)(dVar9 * (local_f0._dist._M_param._M_b - local_f0._dist._M_param._M_a) +
                      local_f0._dist._M_param._M_a) + (float)local_88._0_4_;
          auVar11._8_4_ = 0;
          auVar11._12_4_ = (float)local_88._4_4_ + 0.0;
          auVar12._4_4_ = (float)height;
          auVar12._0_4_ = (float)width;
          auVar12._8_8_ = 0;
          auVar12 = divps(auVar11,auVar12);
          dVar10 = (double)auVar12._0_4_ + -0.5;
          dVar14 = (double)auVar12._4_4_ + -0.5;
          dVar9 = cy.z * dVar14;
          dVar1 = dVar9 + cx.z * dVar10 + cam.d.z;
          auVar15._0_8_ = cam.d.x + dVar14 * cy.x + dVar10 * cx.x;
          auVar15._8_8_ = cam.d.y + dVar14 * cy.y + dVar10 * cx.y;
          dVar10 = dVar1 * dVar1 + auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
          if (dVar10 < 0.0) {
            local_c8._8_4_ = SUB84(dVar9,0);
            local_c8._0_8_ = dVar1;
            local_c8._12_4_ = (int)((ulong)dVar9 >> 0x20);
            local_d8 = auVar15;
            dVar10 = sqrt(dVar10);
            auVar15 = local_d8;
            dVar1 = (double)local_c8._0_8_;
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          iVar8 = iVar8 + iVar5;
          local_40 = dVar1 / dVar10;
          auVar13._8_8_ = dVar10;
          auVar13._0_8_ = dVar10;
          local_68._24_16_ = divpd(auVar15,auVar13);
          local_68._16_8_ = cam.o.z;
          local_68._0_8_ = cam.o.x;
          local_68._8_8_ = cam.o.y;
          Radiance(&local_b0,&spheres,(Ray *)local_68,&local_f0,0,1);
          bcg_img[iVar8] =
               (float)(((local_b0.x + local_b0.y + local_b0.z) / 3.0 +
                       (double)((float)nPasses * bcg_img[iVar8])) / (double)(nPasses + 1));
          iVar6 = iVar6 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar6 < width);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < height);
  }
  nPasses = nPasses + 1;
  return;
}

Assistant:

void RadianceTexture() {

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      Random rng(y + height*clock());

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/float(width)  - .5) +
                    cy*((dy + y)/float(height) - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         Vector radiance = Radiance(spheres, ray, rng, 0, 1);

         bcg_img[i] = (float(nPasses)*bcg_img[i] + Vector::Dot(radiance, Vector(1,1,1))/3.0f) / float(nPasses+1);
      }
   }

   ++nPasses;
}